

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O1

int keysymToQtKey_internal
              (xkb_keysym_t keysym,KeyboardModifiers modifiers,xkb_state *state,xkb_keycode_t code,
              bool superAsMeta,bool hyperAsMeta)

{
  char16_t cVar1;
  Data *pDVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  uint uVar5;
  int iVar6;
  ArrayType<_1dece4ca_> *pAVar7;
  char16_t *pcVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  wchar32 wVar13;
  long in_FS_OFFSET;
  xkb_keysym_t upper;
  xkb_keysym_t lower;
  QString local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  ulong local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (keysym - 0xffbe < 0x23) {
    uVar11 = keysym + 0xff0072;
  }
  else if (keysym - 0xffb0 < 10) {
    uVar11 = keysym - 0xff80;
  }
  else if (keysym - 0x20 < 0xe0) {
    local_48 = (QArrayData *)CONCAT44(local_48._4_4_,0xaaaaaaaa);
    local_68.d.d = (Data *)CONCAT44(local_68.d.d._4_4_,0xaaaaaaaa);
    QXkbCommon::xkbcommon_XConvertCase(keysym,(xkb_keysym_t *)&local_48,(xkb_keysym_t *)&local_68);
    uVar11 = (uint)local_68.d.d;
    if (0xdf < (uint)local_68.d.d - 0x20) {
      uVar11 = keysym;
    }
  }
  else {
    uVar9 = 0x131;
    pAVar7 = &KeyTbl;
    do {
      uVar10 = uVar9 >> 1;
      uVar12 = ~uVar10 + uVar9;
      uVar9 = uVar10;
      if (((xkb2qt *)((long)pAVar7 + uVar10 * 8))->xkb < keysym) {
        pAVar7 = (ArrayType<_1dece4ca_> *)((xkb2qt *)((long)pAVar7 + uVar10 * 8) + 1);
        uVar9 = uVar12;
      }
    } while (0 < (long)uVar9);
    uVar11 = 0;
    if ((pAVar7 != (ArrayType<_1dece4ca_> *)&DAT_006de268) &&
       (uVar11 = 0, ((xkb2qt *)&pAVar7->_M_elems[0].xkb)->xkb <= keysym)) {
      uVar11 = ((xkb2qt *)&pAVar7->_M_elems[0].qt)->xkb;
    }
    uVar5 = uVar11;
    if (uVar11 + 0xfeffffad < 2) {
      uVar5 = 0x1000022;
    }
    if (!superAsMeta) {
      uVar5 = uVar11;
    }
    uVar11 = 0x1000022;
    if ((uVar5 & 0xfffffffe) != 0x1000056) {
      uVar11 = uVar5;
    }
    if (!hyperAsMeta) {
      uVar11 = uVar5;
    }
  }
  if (uVar11 == 0) {
    local_48 = (QArrayData *)0x0;
    pcStack_40 = (char16_t *)0x0;
    local_38 = 0;
    if (state == (xkb_state *)0x0 ||
        ((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
      QXkbCommon::lookupStringNoKeysymTransformations(&local_68,keysym);
    }
    else {
      QXkbCommon::lookupString(&local_68,state,code);
    }
    pcVar8 = pcStack_40;
    pQVar4 = local_48;
    qVar3 = local_68.d.size;
    pDVar2 = local_68.d.d;
    local_68.d.d = (Data *)local_48;
    local_48 = &pDVar2->super_QArrayData;
    pcStack_40 = local_68.d.ptr;
    local_68.d.ptr = pcVar8;
    local_68.d.size = local_38;
    local_38 = qVar3;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    uVar5 = 0;
    uVar11 = 0;
    if (local_38 != 0) {
      pcVar8 = pcStack_40;
      if (pcStack_40 == (char16_t *)0x0) {
        pcVar8 = (char16_t *)&QString::_empty;
      }
      wVar13 = (wchar32)(ushort)*pcVar8;
      if (((ushort)*pcVar8 - 0x30 < 10) ||
         ((0x7f < (uint)wVar13 && (iVar6 = QChar::category(wVar13), iVar6 == 3)))) {
        iVar6 = QChar::digitValue(wVar13);
        uVar11 = iVar6 + 0x30;
      }
      else {
        QString::toUpper_helper(&local_68);
        pcVar8 = pcStack_40;
        pQVar4 = local_48;
        qVar3 = local_68.d.size;
        pDVar2 = local_68.d.d;
        local_68.d.d = (Data *)local_48;
        local_48 = &pDVar2->super_QArrayData;
        pcStack_40 = local_68.d.ptr;
        local_68.d.ptr = pcVar8;
        local_68.d.size = local_38;
        local_38 = qVar3;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
        cVar1 = *pcStack_40;
        if ((cVar1 & 0xf800U) == 0xd800) {
          uVar11 = uVar5;
          if (((1 < local_38) && ((cVar1 & 0xdc00U) == 0xd800)) &&
             ((pcStack_40[1] & 0xfc00U) == 0xdc00)) {
            uVar11 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcStack_40[1] + 0xfca02400;
          }
        }
        else {
          uVar11 = (uint)(ushort)cVar1;
        }
      }
    }
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar11;
  }
  __stack_chk_fail();
}

Assistant:

static int keysymToQtKey_internal(xkb_keysym_t keysym, Qt::KeyboardModifiers modifiers,
                                  xkb_state *state, xkb_keycode_t code,
                                  bool superAsMeta, bool hyperAsMeta)
{
    int qtKey = 0;

    // lookup from direct mapping
    if (keysym >= XKB_KEY_F1 && keysym <= XKB_KEY_F35) {
        // function keys
        qtKey = Qt::Key_F1 + (keysym - XKB_KEY_F1);
    } else if (keysym >= XKB_KEY_KP_0 && keysym <= XKB_KEY_KP_9) {
        // numeric keypad keys
        qtKey = Qt::Key_0 + (keysym - XKB_KEY_KP_0);
    } else if (QXkbCommon::isLatin1(keysym)) {
        // Most Qt::Key values are determined by their upper-case version,
        // where this is in the Latin-1 repertoire. So start with that:
        qtKey = QXkbCommon::qxkbcommon_xkb_keysym_to_upper(keysym);
        // However, Key_mu and Key_ydiaeresis are U+00B5 MICRO SIGN and
        // U+00FF LATIN SMALL LETTER Y WITH DIAERESIS, both lower-case,
        // with upper-case forms outside Latin-1, so use them as they are
        // since they're the Qt::Key values.
        if (!QXkbCommon::isLatin1(qtKey))
            qtKey = keysym;
    } else {
        // check if we have a direct mapping
        xkb2qt_t searchKey{keysym, 0};
        auto it = std::lower_bound(KeyTbl.cbegin(), KeyTbl.cend(), searchKey);
        if (it != KeyTbl.end() && !(searchKey < *it))
            qtKey = it->qt;

        // translate Super/Hyper keys to Meta if we're using them as the MetaModifier
        if (superAsMeta && (qtKey == Qt::Key_Super_L || qtKey == Qt::Key_Super_R))
            qtKey = Qt::Key_Meta;
        if (hyperAsMeta && (qtKey == Qt::Key_Hyper_L || qtKey == Qt::Key_Hyper_R))
            qtKey = Qt::Key_Meta;
    }

    if (qtKey)
        return qtKey;

    // lookup from unicode
    QString text;
    if (!state || modifiers & Qt::ControlModifier) {
        // Control modifier changes the text to ASCII control character, therefore we
        // can't use this text to map keysym to a qt key. We can use the same keysym
        // (it is not affectd by transformation) to obtain untransformed text. For details
        // see "Appendix A. Default Symbol Transformations" in the XKB specification.
        text = QXkbCommon::lookupStringNoKeysymTransformations(keysym);
    } else {
        text = QXkbCommon::lookupString(state, code);
    }
    if (!text.isEmpty()) {
         if (text.unicode()->isDigit()) {
             // Ensures that also non-latin digits are mapped to corresponding qt keys,
             // e.g CTRL + ۲ (arabic two), is mapped to CTRL + Qt::Key_2.
             qtKey = Qt::Key_0 + text.unicode()->digitValue();
         } else {
             text = text.toUpper();
             QStringIterator i(text);
             qtKey = i.next(0);
         }
    }

    return qtKey;
}